

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O3

DecodeStatus
DecodeMemMMReglistImm4Lsl2(MCInst *Inst,uint Insn,uint64_t Address,MCRegisterInfo *Decoder)

{
  DecodeStatus extraout_EAX;
  long lVar1;
  
  lVar1 = 0;
  do {
    MCOperand_CreateReg0(Inst,*(uint *)((long)&DAT_003aa1d0 + lVar1));
    lVar1 = lVar1 + 4;
  } while ((ulong)(Insn >> 2 & 0xc) + 4 != lVar1);
  MCOperand_CreateReg0(Inst,0x13);
  MCOperand_CreateReg0(Inst,0x14);
  MCOperand_CreateImm0(Inst,(long)((int)(Insn << 0x1c) >> 0x1a));
  return extraout_EAX;
}

Assistant:

static DecodeStatus DecodeMemMMReglistImm4Lsl2(MCInst *Inst,
		unsigned Insn, uint64_t Address, MCRegisterInfo *Decoder)
{
	int Offset = SignExtend32(Insn & 0xf, 4);

	if (DecodeRegListOperand16(Inst, Insn, Address, Decoder) == MCDisassembler_Fail)
		return MCDisassembler_Fail;

	MCOperand_CreateReg0(Inst, Mips_SP);
	MCOperand_CreateImm0(Inst, Offset * 4);

	return MCDisassembler_Success;
}